

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O2

int __thiscall
jrtplib::RTPSources::ProcessRTCPSenderInfo
          (RTPSources *this,uint32_t ssrc,RTPNTPTime *ntptime,uint32_t rtptime,uint32_t packetcount,
          uint32_t octetcount,RTPTime *receivetime,RTPAddress *senderaddress)

{
  double dVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  bool bVar8;
  undefined3 uVar9;
  int iVar10;
  bool local_3d;
  uint32_t local_3c;
  RTPInternalSourceData *local_38;
  
  local_3c = octetcount;
  iVar10 = GetRTCPSourceData(this,ssrc,senderaddress,&local_38,&local_3d);
  if ((-1 < iVar10) && (local_38 != (RTPInternalSourceData *)0x0)) {
    bVar8 = (local_38->super_RTPSourceData).SRinf.hasinfo;
    uVar9 = *(undefined3 *)&(local_38->super_RTPSourceData).SRinf.field_0x1;
    uVar2 = (local_38->super_RTPSourceData).SRinf.ntptimestamp.msw;
    uVar3 = (local_38->super_RTPSourceData).SRinf.ntptimestamp.lsw;
    uVar4 = (local_38->super_RTPSourceData).SRinf.rtptimestamp;
    uVar5 = (local_38->super_RTPSourceData).SRinf.bytecount;
    uVar6 = *(undefined4 *)&(local_38->super_RTPSourceData).SRinf.receivetime.m_t;
    uVar7 = *(undefined4 *)((long)&(local_38->super_RTPSourceData).SRinf.receivetime.m_t + 4);
    (local_38->super_RTPSourceData).SRprevinf.packetcount =
         (local_38->super_RTPSourceData).SRinf.packetcount;
    (local_38->super_RTPSourceData).SRprevinf.bytecount = uVar5;
    *(undefined4 *)&(local_38->super_RTPSourceData).SRprevinf.receivetime.m_t = uVar6;
    *(undefined4 *)((long)&(local_38->super_RTPSourceData).SRprevinf.receivetime.m_t + 4) = uVar7;
    (local_38->super_RTPSourceData).SRprevinf.hasinfo = bVar8;
    *(undefined3 *)&(local_38->super_RTPSourceData).SRprevinf.field_0x1 = uVar9;
    (local_38->super_RTPSourceData).SRprevinf.ntptimestamp.msw = uVar2;
    (local_38->super_RTPSourceData).SRprevinf.ntptimestamp.lsw = uVar3;
    (local_38->super_RTPSourceData).SRprevinf.rtptimestamp = uVar4;
    (local_38->super_RTPSourceData).SRinf.ntptimestamp = *ntptime;
    (local_38->super_RTPSourceData).SRinf.rtptimestamp = rtptime;
    (local_38->super_RTPSourceData).SRinf.packetcount = packetcount;
    (local_38->super_RTPSourceData).SRinf.bytecount = local_3c;
    dVar1 = receivetime->m_t;
    (local_38->super_RTPSourceData).SRinf.receivetime.m_t = dVar1;
    (local_38->super_RTPSourceData).SRinf.hasinfo = true;
    (local_38->super_RTPSourceData).stats.lastmsgtime.m_t = dVar1;
    if (local_3d == true) {
      (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[6])(this,local_38);
    }
    (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[0xb])(this,local_38);
  }
  return iVar10;
}

Assistant:

int RTPSources::ProcessRTCPSenderInfo(uint32_t ssrc,const RTPNTPTime &ntptime,uint32_t rtptime,
                          uint32_t packetcount,uint32_t octetcount,const RTPTime &receivetime,
			  const RTPAddress *senderaddress)
{
	RTPInternalSourceData *srcdat;
	bool created;
	int status;
	
	status = GetRTCPSourceData(ssrc,senderaddress,&srcdat,&created);
	if (status < 0)
		return status;
	if (srcdat == 0)
		return 0;
	
	srcdat->ProcessSenderInfo(ntptime,rtptime,packetcount,octetcount,receivetime);
	
	// Call the callback
	if (created)
		OnNewSource(srcdat);

	OnRTCPSenderReport(srcdat);

	return 0;
}